

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::insertToolBar(QMainWindow *this,QToolBar *before,QToolBar *toolbar)

{
  char *in_RDX;
  QMainWindowLayout *in_RDI;
  long in_FS_OFFSET;
  QMainWindowPrivate *d;
  QToolBar *in_stack_ffffffffffffffa8;
  QObject *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  ToolButtonStyle in_stack_ffffffffffffffbc;
  undefined4 uVar1;
  QToolBarPrivate *in_stack_ffffffffffffffc0;
  QMainWindowLayout *this_01;
  undefined1 local_18 [16];
  _func_int **local_8;
  
  local_8 = *(_func_int ***)(in_FS_OFFSET + 0x28);
  d_func((QMainWindow *)0x5e9eb4);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e9eca);
  QMainWindowLayout::removeToolBar(in_RDI,in_stack_ffffffffffffffa8);
  QToolBar::d_func((QToolBar *)0x5e9ee1);
  QToolBarPrivate::_q_updateIconSize
            (in_stack_ffffffffffffffc0,
             (QSize *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QToolBar::d_func((QToolBar *)0x5e9eff);
  QToolBarPrivate::_q_updateToolButtonStyle(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  this_00 = (QObject *)(local_18 + 8);
  uVar1 = 0;
  QObject::connect(this_00,(char *)in_RDI,(QObject *)"2iconSizeChanged(QSize)",in_RDX,0xb1d040);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  this_01 = (QMainWindowLayout *)local_18;
  QObject::connect((QObject *)this_01,(char *)in_RDI,
                   (QObject *)"2toolButtonStyleChanged(Qt::ToolButtonStyle)",in_RDX,0xb1d087);
  QMetaObject::Connection::~Connection((Connection *)this_01);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e9f90);
  QMainWindowLayout::insertToolBar
            (this_01,(QToolBar *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),(QToolBar *)in_RDI);
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindow::insertToolBar(QToolBar *before, QToolBar *toolbar)
{
    Q_D(QMainWindow);

    d->layout->removeToolBar(toolbar);

    toolbar->d_func()->_q_updateIconSize(d->iconSize);
    toolbar->d_func()->_q_updateToolButtonStyle(d->toolButtonStyle);
    connect(this, SIGNAL(iconSizeChanged(QSize)),
            toolbar, SLOT(_q_updateIconSize(QSize)));
    connect(this, SIGNAL(toolButtonStyleChanged(Qt::ToolButtonStyle)),
            toolbar, SLOT(_q_updateToolButtonStyle(Qt::ToolButtonStyle)));

    d->layout->insertToolBar(before, toolbar);
}